

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorTorque.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorTorque::IntLoadResidual_F
          (ChShaftsMotorTorque *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  element_type *peVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  peVar3 = (this->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar7 = (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
          ChTime;
  (*peVar3->_vptr_ChFunction[4])(peVar3,CONCAT44(in_register_00000034,off));
  iVar5 = (*(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1)->super_ChPhysicsItem).
            super_ChObj._vptr_ChObj[9])();
  if ((char)iVar5 != '\0') {
    uVar6 = (ulong)(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1)->
                   super_ChPhysicsItem).offset_w;
    if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)uVar6) goto LAB_005eb176;
    pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pdVar4[uVar6];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar7;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = c;
    auVar1 = vfmadd231sd_fma(auVar8,auVar10,auVar1);
    pdVar4[uVar6] = auVar1._0_8_;
  }
  iVar5 = (*(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft2)->super_ChPhysicsItem).
            super_ChObj._vptr_ChObj[9])();
  if ((char)iVar5 != '\0') {
    uVar6 = (ulong)(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft2)->
                   super_ChPhysicsItem).offset_w;
    if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)uVar6) {
LAB_005eb176:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = c;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar7;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pdVar4[uVar6];
    auVar1 = vfnmadd213sd_fma(auVar9,auVar11,auVar2);
    pdVar4[uVar6] = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChShaftsMotorTorque::IntLoadResidual_F(const unsigned int off,  // offset in R residual
                                ChVectorDynamic<>& R,    // result: the R residual, R += c*F
                                const double c           // a scaling factor
                                ) {
    double imposed_torque = this->f_torque->Get_y(this->GetChTime());
    if (shaft1->IsActive())
        R(shaft1->GetOffset_w()) +=  imposed_torque * c;
    if (shaft2->IsActive())
        R(shaft2->GetOffset_w()) += -imposed_torque * c;
}